

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-tests.cpp
# Opt level: O1

void AllocateAllAndThenRelease(bool *result)

{
  void *pointer;
  size_t sVar1;
  undefined8 *puVar2;
  undefined4 *puVar3;
  ClassWithMemAllocations *pCVar4;
  LibClass *pLVar5;
  ComplexClass *pCVar6;
  undefined8 uVar7;
  uint64_t uVar8;
  long lVar9;
  uint64_t memLeakSize;
  size_t memLeakCount;
  ComplexClass *complexClassArr [10000];
  LibClass *libClassArr [10000];
  ClassWithMemAllocations *classWithMemAllocationsArr [10000];
  InheritedClass *inheritedClassArr [10000];
  SimpleClass *simpleClassArr [10000];
  SimpleStruct *simpleStructArr [10000];
  uint64_t uStack_75338;
  uint64_t uStack_75330;
  undefined8 auStack_75328 [10000];
  undefined8 auStack_61aa8 [10000];
  undefined8 auStack_4e228 [10000];
  undefined8 auStack_3a9a8 [10000];
  undefined8 auStack_27128 [10000];
  undefined8 auStack_138a8 [10000];
  
  lVar9 = 0;
  __start(false,"",false);
  sVar1 = LibClass::getSizeOfInternalClass();
  do {
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = 0;
    *(undefined8 **)((long)auStack_138a8 + lVar9) = puVar2;
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = 0x3ff199999999999a;
    *(undefined8 **)((long)auStack_27128 + lVar9) = puVar2;
    puVar2 = (undefined8 *)operator_new(0x10);
    *puVar2 = 0x3ff199999999999a;
    puVar3 = (undefined4 *)operator_new(4);
    *puVar3 = 10000;
    puVar2[1] = puVar3;
    *(undefined8 **)((long)auStack_3a9a8 + lVar9) = puVar2;
    pCVar4 = (ClassWithMemAllocations *)operator_new(0x18);
    ClassWithMemAllocations::ClassWithMemAllocations(pCVar4);
    *(ClassWithMemAllocations **)((long)auStack_4e228 + lVar9) = pCVar4;
    pLVar5 = (LibClass *)operator_new(0x50);
    LibClass::LibClass(pLVar5);
    *(LibClass **)((long)auStack_61aa8 + lVar9) = pLVar5;
    pCVar6 = (ComplexClass *)operator_new(0x20);
    ComplexClass::ComplexClass(pCVar6);
    *(ComplexClass **)((long)auStack_75328 + lVar9) = pCVar6;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 80000);
  __mem_leak_check(&uStack_75330,&uStack_75338,false,"",false);
  if (uStack_75330 == 230000) {
    uVar8 = sVar1 * 20000 + 0x5747c0;
    if (uStack_75338 == uVar8) {
      lVar9 = 0;
      do {
        if (*(void **)((long)auStack_138a8 + lVar9) != (void *)0x0) {
          operator_delete(*(void **)((long)auStack_138a8 + lVar9),8);
        }
        if (*(void **)((long)auStack_27128 + lVar9) != (void *)0x0) {
          operator_delete(*(void **)((long)auStack_27128 + lVar9),8);
        }
        pointer = *(void **)((long)auStack_3a9a8 + lVar9);
        if (pointer != (void *)0x0) {
          if (*(void **)((long)pointer + 8) != (void *)0x0) {
            operator_delete(*(void **)((long)pointer + 8),4);
          }
          operator_delete(pointer,0x10);
        }
        pCVar4 = *(ClassWithMemAllocations **)((long)auStack_4e228 + lVar9);
        if (pCVar4 != (ClassWithMemAllocations *)0x0) {
          ClassWithMemAllocations::~ClassWithMemAllocations(pCVar4);
          operator_delete(pCVar4,0x18);
        }
        pLVar5 = *(LibClass **)((long)auStack_61aa8 + lVar9);
        if (pLVar5 != (LibClass *)0x0) {
          LibClass::~LibClass(pLVar5);
          operator_delete(pLVar5,0x50);
        }
        pCVar6 = *(ComplexClass **)((long)auStack_75328 + lVar9);
        if (pCVar6 != (ComplexClass *)0x0) {
          ComplexClass::~ComplexClass(pCVar6);
          operator_delete(pCVar6,0x20);
        }
        lVar9 = lVar9 + 8;
      } while (lVar9 != 80000);
      __mem_leak_check(&uStack_75330,&uStack_75338,false,"",false);
      if ((uStack_75330 == 0) && (uStack_75330 = uStack_75338, uStack_75338 == 0)) {
        __stop_and_free_all_mem();
        return;
      }
      uVar7 = 0x87;
      uVar8 = 0;
    }
    else {
      uVar7 = 0x7b;
      uStack_75330 = uStack_75338;
    }
  }
  else {
    uVar7 = 0x7b;
    uVar8 = 230000;
  }
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n",
         "AllocateAllAndThenRelease",uVar7,uStack_75330,uVar8);
  *result = false;
  return;
}

Assistant:

TEST_CASE(AllocateAllAndThenRelease) {

    START_TEST;

    size_t sizeOfSimpleStruct = sizeof(SimpleStruct);
    size_t sizeOfSimpleClass = sizeof(SimpleClass);
    size_t sizeOfInheritedClass = sizeof(InheritedClass) + sizeof(int);
    size_t sizeOfClassWithMemAllocations = sizeof(ClassWithMemAllocations) + sizeof(int) + 12*sizeof(char) + 20*sizeof(float);
    size_t sizeOfLibClass = sizeof(LibClass) + sizeof(double) + LibClass::getSizeOfInternalClass();
    size_t sizeOfComplexClass = sizeof(ComplexClass) + 10*sizeOfSimpleStruct + sizeOfSimpleClass + sizeOfClassWithMemAllocations + sizeOfLibClass;

    SimpleStruct* simpleStructArr[NUM_OF_OBJECTS];
    SimpleClass* simpleClassArr[NUM_OF_OBJECTS];
    InheritedClass* inheritedClassArr[NUM_OF_OBJECTS];
    ClassWithMemAllocations* classWithMemAllocationsArr[NUM_OF_OBJECTS];
    LibClass* libClassArr[NUM_OF_OBJECTS];
    ComplexClass* complexClassArr[NUM_OF_OBJECTS];

    for (int i=0; i < NUM_OF_OBJECTS; i++) {
        simpleStructArr[i] = new SimpleStruct();
        simpleClassArr[i] = new SimpleClass();
        inheritedClassArr[i] = new InheritedClass();
        classWithMemAllocationsArr[i] = new ClassWithMemAllocations();
        libClassArr[i] = new LibClass();
        complexClassArr[i] = new ComplexClass();
    }

    #if !defined _MSC_VER || !defined _DEBUG
    CHECK_MEM_LEAK(NUM_OF_OBJECTS*23, NUM_OF_OBJECTS*(
        sizeOfSimpleStruct + 
        sizeOfSimpleClass + 
        sizeOfInheritedClass + 
        sizeOfClassWithMemAllocations +
        sizeOfLibClass +
        sizeOfComplexClass));
    #endif

    for (int i=0; i < NUM_OF_OBJECTS; i++) {
        delete simpleStructArr[i];
        delete simpleClassArr[i];
        delete inheritedClassArr[i];
        delete classWithMemAllocationsArr[i];
        delete libClassArr[i];
        delete complexClassArr[i];
    }

    CHECK_MEM_LEAK(0, 0);

    STOP_TEST;
}